

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O1

void Mio_SopPushSCC(Vec_Int_t *p,uint c)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = p->nSize;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar2 = 0;
  }
  else {
    piVar1 = p->pArray;
    lVar3 = 0;
    uVar2 = 0;
    do {
      uVar4 = piVar1[lVar3];
      if ((uVar4 | c) == c) {
        if ((uint)lVar3 != uVar2) {
          __assert_fail("i == k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mio/mioSop.c"
                        ,0x3c,"void Mio_SopPushSCC(Vec_Int_t *, unsigned int)");
        }
        return;
      }
      if ((uVar4 | c) != uVar4) {
        if (((int)uVar2 < 0) || ((int)uVar5 <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
        piVar1[uVar5] = uVar4;
      }
      lVar3 = lVar3 + 1;
      uVar4 = p->nSize;
      uVar5 = (ulong)(int)uVar4;
    } while (lVar3 < (long)uVar5);
  }
  if ((int)uVar4 < (int)uVar2) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  p->nSize = uVar2;
  Vec_IntPush(p,c);
  return;
}

Assistant:

void Mio_SopPushSCC( Vec_Int_t * p, unsigned c )
{
    unsigned Entry;
    int i, k = 0;
    Vec_IntForEachEntry( p, Entry, i )
    {
        if ( Mio_CubeContains( Entry, c ) ) // Entry contains c
        {
            assert( i == k );
            return;
        }
        if ( Mio_CubeContains( c, Entry ) ) // c contains Entry
            continue;
        Vec_IntWriteEntry( p, k++, Entry );
    }
    Vec_IntShrink( p, k );
    Vec_IntPush( p, c );
}